

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging_tests.cpp
# Opt level: O0

void __thiscall
logging_tests::logging_LogPrintMacrosDeprecated::test_method(logging_LogPrintMacrosDeprecated *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view source_file_03;
  string_view source_file_04;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view logging_function_03;
  string_view logging_function_04;
  bool bVar1;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  right_end;
  iterator left_begin;
  iterator left_end;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_RDI;
  long in_FS_OFFSET;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  expected;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  log_lines;
  string log;
  ifstream file;
  undefined8 in_stack_fffffffffffffa38;
  undefined4 uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  char *__x;
  char *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa50;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffa58;
  const_string *in_stack_fffffffffffffa60;
  size_t in_stack_fffffffffffffa68;
  const_string *in_stack_fffffffffffffa70;
  allocator<char> *in_stack_fffffffffffffa78;
  iterator in_stack_fffffffffffffa80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa88;
  LogFlags in_stack_fffffffffffffaa0;
  undefined8 in_stack_fffffffffffffaa8;
  int source_line;
  string *local_538;
  ConstevalFormatString<1U> in_stack_fffffffffffffae8;
  size_t in_stack_fffffffffffffaf0;
  char *in_stack_fffffffffffffaf8;
  equal_coll_impl *this_02;
  size_t in_stack_fffffffffffffb00;
  char *in_stack_fffffffffffffb08;
  Level in_stack_fffffffffffffbe0;
  char (*in_stack_fffffffffffffbf0) [6];
  assertion_result local_400 [2];
  allocator<char> local_3c5;
  allocator<char> local_3c4;
  allocator<char> local_3c3;
  allocator<char> local_3c2;
  allocator<char> local_3c1 [241];
  string local_2d0 [64];
  equal_coll_impl local_290 [96];
  string local_230 [32];
  istream local_210 [520];
  long local_8;
  
  source_line = (int)((ulong)in_stack_fffffffffffffaa8 >> 0x20);
  uVar2 = (undefined4)((ulong)in_stack_fffffffffffffa38 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_fffffffffffffa58,(char *)in_stack_fffffffffffffa50);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_fffffffffffffa58,(char *)in_stack_fffffffffffffa50);
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)CONCAT44(uVar2,2);
  __x = "foo5: %s\n";
  this_01 = "bar5";
  logging_function._M_str = in_stack_fffffffffffffb08;
  logging_function._M_len = in_stack_fffffffffffffb00;
  source_file._M_str = in_stack_fffffffffffffaf8;
  source_file._M_len = in_stack_fffffffffffffaf0;
  LogPrintFormatInternal<char[5]>
            (logging_function,source_file,source_line,in_stack_fffffffffffffaa0,
             in_stack_fffffffffffffbe0,in_stack_fffffffffffffae8,
             (char (*) [5])in_stack_fffffffffffffbf0);
  bVar1 = ::LogAcceptCategory((LogFlags)this_00,Trace);
  if (bVar1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffa58,(char *)in_stack_fffffffffffffa50);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffa58,(char *)in_stack_fffffffffffffa50);
    this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              ((ulong)this_00 & 0xffffffff00000000);
    __x = "foo4: %s\n";
    this_01 = "bar4";
    logging_function_00._M_str = in_stack_fffffffffffffb08;
    logging_function_00._M_len = in_stack_fffffffffffffb00;
    source_file_00._M_str = in_stack_fffffffffffffaf8;
    source_file_00._M_len = in_stack_fffffffffffffaf0;
    LogPrintFormatInternal<char[5]>
              (logging_function_00,source_file_00,source_line,in_stack_fffffffffffffaa0,
               in_stack_fffffffffffffbe0,in_stack_fffffffffffffae8,
               (char (*) [5])in_stack_fffffffffffffbf0);
  }
  bVar1 = ::LogAcceptCategory((LogFlags)this_00,Trace);
  if (bVar1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffa58,(char *)in_stack_fffffffffffffa50);
    uVar2 = (undefined4)((ulong)this_00 >> 0x20);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffa58,(char *)in_stack_fffffffffffffa50);
    this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)CONCAT44(uVar2,1)
    ;
    __x = "foo7: %s\n";
    this_01 = "bar7";
    logging_function_01._M_str = in_stack_fffffffffffffb08;
    logging_function_01._M_len = in_stack_fffffffffffffb00;
    source_file_01._M_str = in_stack_fffffffffffffaf8;
    source_file_01._M_len = in_stack_fffffffffffffaf0;
    LogPrintFormatInternal<char[5]>
              (logging_function_01,source_file_01,source_line,in_stack_fffffffffffffaa0,
               in_stack_fffffffffffffbe0,in_stack_fffffffffffffae8,
               (char (*) [5])in_stack_fffffffffffffbf0);
  }
  bVar1 = ::LogAcceptCategory((LogFlags)this_00,Trace);
  if (bVar1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffa58,(char *)in_stack_fffffffffffffa50);
    uVar2 = (undefined4)((ulong)this_00 >> 0x20);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffa58,(char *)in_stack_fffffffffffffa50);
    this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)CONCAT44(uVar2,2)
    ;
    __x = "foo8: %s\n";
    this_01 = "bar8";
    logging_function_02._M_str = in_stack_fffffffffffffb08;
    logging_function_02._M_len = in_stack_fffffffffffffb00;
    source_file_02._M_str = in_stack_fffffffffffffaf8;
    source_file_02._M_len = in_stack_fffffffffffffaf0;
    LogPrintFormatInternal<char[5]>
              (logging_function_02,source_file_02,source_line,in_stack_fffffffffffffaa0,
               in_stack_fffffffffffffbe0,in_stack_fffffffffffffae8,
               (char (*) [5])in_stack_fffffffffffffbf0);
  }
  bVar1 = ::LogAcceptCategory((LogFlags)this_00,Trace);
  if (bVar1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffa58,(char *)in_stack_fffffffffffffa50);
    uVar2 = (undefined4)((ulong)this_00 >> 0x20);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffa58,(char *)in_stack_fffffffffffffa50);
    this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)CONCAT44(uVar2,3)
    ;
    __x = "foo9: %s\n";
    this_01 = "bar9";
    logging_function_03._M_str = in_stack_fffffffffffffb08;
    logging_function_03._M_len = in_stack_fffffffffffffb00;
    source_file_03._M_str = in_stack_fffffffffffffaf8;
    source_file_03._M_len = in_stack_fffffffffffffaf0;
    LogPrintFormatInternal<char[5]>
              (logging_function_03,source_file_03,source_line,in_stack_fffffffffffffaa0,
               in_stack_fffffffffffffbe0,in_stack_fffffffffffffae8,
               (char (*) [5])in_stack_fffffffffffffbf0);
  }
  bVar1 = ::LogAcceptCategory((LogFlags)this_00,Trace);
  if (bVar1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffa58,(char *)in_stack_fffffffffffffa50);
    uVar2 = (undefined4)((ulong)this_00 >> 0x20);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffa58,(char *)in_stack_fffffffffffffa50);
    this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)CONCAT44(uVar2,4)
    ;
    __x = "foo10: %s\n";
    this_01 = "bar10";
    logging_function_04._M_str = in_stack_fffffffffffffb08;
    logging_function_04._M_len = in_stack_fffffffffffffb00;
    source_file_04._M_str = in_stack_fffffffffffffaf8;
    source_file_04._M_len = in_stack_fffffffffffffaf0;
    LogPrintFormatInternal<char[6]>
              (logging_function_04,source_file_04,source_line,in_stack_fffffffffffffaa0,
               in_stack_fffffffffffffbe0,in_stack_fffffffffffffae8,in_stack_fffffffffffffbf0);
  }
  std::ifstream::ifstream<fs::path,fs::path>
            ((basic_ifstream<char,_std::char_traits<char>_> *)this_01,(path *)__x,
             (openmode)((ulong)this_00 >> 0x20));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)this_00);
  std::__cxx11::string::string(in_stack_fffffffffffffa50);
  while( true ) {
    right_end._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::getline<char,std::char_traits<char>,std::allocator<char>>(local_210,local_230);
    bVar1 = std::ios::operator_cast_to_bool
                      ((ios *)((long)&((right_end._M_current)->_M_dataplus)._M_p +
                              *(long *)(((right_end._M_current)->_M_dataplus)._M_p + -0x18)));
    if (!bVar1) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)this_01,(value_type *)__x);
  }
  std::__cxx11::string::~string(this_00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa88,(char *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa88,(char *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
  this_02 = local_290;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa88,(char *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa88,(char *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa88,(char *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)this_00);
  __l._M_len = (size_type)in_stack_fffffffffffffa88;
  __l._M_array = in_stack_fffffffffffffa80;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffffa78,__l,(allocator_type *)in_stack_fffffffffffffa70);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)this_00);
  local_538 = local_230;
  do {
    local_538 = local_538 + -0x20;
    std::__cxx11::string::~string(this_00);
  } while (local_538 != local_2d0);
  std::allocator<char>::~allocator(&local_3c5);
  std::allocator<char>::~allocator(&local_3c4);
  std::allocator<char>::~allocator(&local_3c3);
  std::allocator<char>::~allocator(&local_3c2);
  std::allocator<char>::~allocator(local_3c1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_01,__x,(unsigned_long)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_00)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffa78,in_stack_fffffffffffffa70,
               in_stack_fffffffffffffa68,in_stack_fffffffffffffa60);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)__x);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)__x);
    left_begin = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)__x);
    left_end = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)__x);
    boost::test_tools::tt_detail::equal_coll_impl::operator()
              (this_02,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        )left_begin._M_current,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )left_end._M_current,in_RDI,right_end);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)__x,(char (*) [1])this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_01,__x,(unsigned_long)this_00);
    this_01 = "log_lines.end()";
    __x = "log_lines.begin()";
    this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00000004;
    boost::test_tools::tt_detail::report_assertion
              (local_400,(lazy_ostream *)&stack0xfffffffffffffbd8,
               (const_string *)&stack0xfffffffffffffbc8,0x83,CHECK,CHECK_EQUAL_COLL);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               this_00);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)this_00);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)this_01);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)this_01);
  std::ifstream::~ifstream(local_210);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_FIXTURE_TEST_CASE(logging_LogPrintMacrosDeprecated, LogSetup)
{
    LogPrintf("foo5: %s\n", "bar5");
    LogPrintLevel(BCLog::NET, BCLog::Level::Trace, "foo4: %s\n", "bar4"); // not logged
    LogPrintLevel(BCLog::NET, BCLog::Level::Debug, "foo7: %s\n", "bar7");
    LogPrintLevel(BCLog::NET, BCLog::Level::Info, "foo8: %s\n", "bar8");
    LogPrintLevel(BCLog::NET, BCLog::Level::Warning, "foo9: %s\n", "bar9");
    LogPrintLevel(BCLog::NET, BCLog::Level::Error, "foo10: %s\n", "bar10");
    std::ifstream file{tmp_log_path};
    std::vector<std::string> log_lines;
    for (std::string log; std::getline(file, log);) {
        log_lines.push_back(log);
    }
    std::vector<std::string> expected = {
        "foo5: bar5",
        "[net] foo7: bar7",
        "[net:info] foo8: bar8",
        "[net:warning] foo9: bar9",
        "[net:error] foo10: bar10",
    };
    BOOST_CHECK_EQUAL_COLLECTIONS(log_lines.begin(), log_lines.end(), expected.begin(), expected.end());
}